

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O2

handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
::lock(handle *__return_storage_ptr__,
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
      *this)

{
  bool bVar1;
  unique_lock<std::shared_mutex> local_18;
  
  bVar1 = this->enabled;
  __return_storage_ptr__->data = &this->m_obj;
  if (bVar1 == true) {
    std::unique_lock<std::shared_mutex>::unique_lock
              (&__return_storage_ptr__->m_handle_lock,&this->m_mutex);
  }
  else {
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_18._M_device = (mutex_type *)0x0;
    local_18._M_owns = false;
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}